

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O2

int Sfm_NodeResubSolve(Sfm_Ntk_t *p,int iNode,int f,int fRemoveOnly)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  word *pwVar11;
  ulong uVar12;
  abctime aVar13;
  word wVar14;
  abctime aVar15;
  ulong uVar16;
  ulong uVar17;
  char *__assertion;
  word uTruth;
  uint local_38;
  int local_34;
  
  if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
    __assertion = "Sfm_ObjIsNode(p, iNode)";
    uVar8 = 0x75;
  }
  else {
    uVar17 = (ulong)(uint)f;
    local_34 = fRemoveOnly;
    if ((-1 < f) && (iVar3 = Sfm_ObjFaninNum(p,iNode), f < iVar3)) {
      p->nTryRemoves = p->nTryRemoves + 1;
      if (p->pPars->fVeryVerbose != 0) {
        local_38 = Vec_IntEntry(&p->vLevels,iNode);
        uVar8 = p->vNodes->nSize;
        uVar9 = p->vDivs->nSize;
        iVar3 = Sfm_ObjFanin(p,iNode,f);
        uVar4 = Sfm_ObjFaninNum(p,iNode);
        iVar5 = Sfm_ObjFanin(p,iNode,f);
        uVar6 = Sfm_ObjMffcSize(p,iVar5);
        printf("%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n",
               iNode,(ulong)local_38,0,(ulong)uVar8,(ulong)uVar9,CONCAT44(extraout_var,iVar3),uVar17
               ,(ulong)uVar4,(ulong)uVar6);
      }
      p->nCexes = 0;
      pVVar1 = p->vDivCexes;
      uVar8 = p->vDivs->nSize;
      if (pVVar1->nCap < (int)uVar8) {
        if (pVVar1->pArray == (word *)0x0) {
          pwVar11 = (word *)malloc((long)(int)uVar8 << 3);
        }
        else {
          pwVar11 = (word *)realloc(pVVar1->pArray,(long)(int)uVar8 << 3);
        }
        pVVar1->pArray = pwVar11;
        if (pwVar11 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar1->nCap = uVar8;
      }
      uVar12 = 0;
      uVar16 = 0;
      if (0 < (int)uVar8) {
        uVar16 = (ulong)uVar8;
      }
      for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        pVVar1->pArray[uVar12] = 0;
      }
      pVVar1->nSize = uVar8;
      p->vDivIds->nSize = 0;
      iVar3 = -1;
      for (iVar5 = 0; iVar7 = Sfm_ObjFaninNum(p,iNode), iVar5 < iVar7; iVar5 = iVar5 + 1) {
        iVar7 = Sfm_ObjFanin(p,iNode,iVar5);
        if (f != iVar5) {
          pVVar2 = p->vDivIds;
          iVar7 = Sfm_ObjSatVar(p,iVar7);
          Vec_IntPush(pVVar2,iVar7);
          iVar7 = iVar3;
        }
        iVar3 = iVar7;
      }
      if (iVar3 == -1) {
        __assert_fail("iFaninRem != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                      ,0x87,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
      }
      iVar5 = Sfm_ObjIsFixed(p,iVar3);
      uVar12 = 0xffffffffffffffff;
      iVar7 = -1;
      if ((iVar5 != 0) && (iVar5 = Sfm_ObjFaninNum(p,iVar3), iVar5 == 1)) {
        iVar7 = Sfm_ObjFanin(p,iVar3,0);
      }
      aVar13 = Abc_Clock();
      wVar14 = Sfm_ComputeInterpolant(p);
      uTruth = wVar14;
      aVar15 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar15 - aVar13);
      if (wVar14 == 0x8765432187654321) {
        iVar3 = 0;
        if (((local_34 == 0) && (p->pPars->fRrOnly == 0)) && (p->vDivs->nSize != 0)) {
          p->nTryResubs = p->nTryResubs + 1;
          iVar3 = p->nCexes;
          while( true ) {
            uVar12 = 0;
            while( true ) {
              iVar5 = (int)uVar12;
              if (((long)p->vDivCexes->nSize <= (long)uVar12) ||
                 ((p->vDivCexes->pArray[uVar12] == 0xffffffffffffffffU >> (-(char)iVar3 & 0x3fU) &&
                  (iVar10 = Vec_IntEntry(p->vDivs,iVar5), iVar10 != iVar7)))) break;
              uVar12 = uVar12 + 1;
            }
            iVar3 = 0;
            if (p->vDivs->nSize == iVar5) break;
            iVar3 = Vec_IntEntry(p->vDivs,iVar5);
            if (iVar3 == iVar7) {
              __assert_fail("Vec_IntEntry(p->vDivs, iVar) != iFaninSkip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                            ,0xb2,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
            }
            pVVar2 = p->vDivIds;
            iVar3 = Vec_IntEntry(p->vDivs,iVar5);
            iVar3 = Sfm_ObjSatVar(p,iVar3);
            Vec_IntPush(pVVar2,iVar3);
            aVar13 = Abc_Clock();
            wVar14 = Sfm_ComputeInterpolant(p);
            uTruth = wVar14;
            aVar15 = Abc_Clock();
            p->timeSat = p->timeSat + (aVar15 - aVar13);
            if (wVar14 != 0x8765432187654321) goto LAB_0044206e;
            iVar3 = p->nCexes;
            if (iVar3 == 0x40) {
              return 0;
            }
            iVar5 = p->vDivIds->nSize;
            if (iVar5 < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            p->vDivIds->nSize = iVar5 + -1;
          }
        }
      }
      else {
LAB_0044206e:
        if (wVar14 == 0x1234567812345678) {
          p->nTimeOuts = p->nTimeOuts + 1;
          iVar3 = 0;
        }
        else {
          iVar3 = (int)uVar12;
          if (p->pPars->fVeryVerbose != 0) {
            uVar8 = Sfm_ObjFanin(p,iNode,f);
            if (iVar3 == -1) {
              printf("Node %d: Fanin %d (%d) can be removed.  ",iNode,uVar17,(ulong)uVar8);
            }
            else {
              uVar9 = Vec_IntEntry(p->vDivs,iVar3);
              printf("Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ",iNode,uVar17,
                     (ulong)uVar8,uVar12 & 0xffffffff,(ulong)uVar9);
            }
            Kit_DsdPrintFromTruth((uint *)&uTruth,p->vDivIds->nSize);
            putchar(10);
          }
          if (iVar3 == -1) {
            p->nRemoves = p->nRemoves + 1;
            iVar3 = -1;
          }
          else {
            p->nResubs = p->nResubs + 1;
            iVar3 = Vec_IntEntry(p->vDivs,iVar3);
          }
          Sfm_NtkUpdate(p,iNode,f,iVar3,uTruth);
          iVar3 = 1;
        }
      }
      return iVar3;
    }
    __assertion = "f >= 0 && f < Sfm_ObjFaninNum(p, iNode)";
    uVar8 = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                ,uVar8,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
}

Assistant:

int Sfm_NodeResubSolve( Sfm_Ntk_t * p, int iNode, int f, int fRemoveOnly )
{
    int fSkipUpdate  = 0;
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_IntSize(p->vDivs) < 200;// || pNode->Id == 556;
    int i, iFanin, iVar = -1;
    int iFaninRem = -1, iFaninSkip = -1;
    word uTruth, uSign, uMask;
    abctime clk;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( f >= 0 && f < Sfm_ObjFaninNum(p, iNode) );
    p->nTryRemoves++;
    // report init stats
    if ( p->pPars->fVeryVerbose )
        printf( "%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n", 
            iNode, Sfm_ObjLevel(p, iNode), 0, Vec_IntSize(p->vNodes), Vec_IntSize(p->vDivs), 
            Sfm_ObjFanin(p, iNode, f), f, Sfm_ObjFaninNum(p, iNode), Sfm_ObjMffcSize(p, Sfm_ObjFanin(p, iNode, f)) );
    // clean simulation info
    p->nCexes = 0;
    Vec_WrdFill( p->vDivCexes, Vec_IntSize(p->vDivs), 0 );
    // try removing the critical fanin
    Vec_IntClear( p->vDivIds );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( i != f )
            Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iFanin) );
        else
            iFaninRem = iFanin;
    assert( iFaninRem != -1 );
    // find fanin to skip 
    if ( Sfm_ObjIsFixed(p, iFaninRem) && Sfm_ObjFaninNum(p, iFaninRem) == 1 )
        iFaninSkip = Sfm_ObjFanin(p, iFaninRem, 0);
clk = Abc_Clock();
    uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
    // analyze outcomes
    if ( uTruth == SFM_SAT_UNDEC )
    {
        p->nTimeOuts++;
        return 0;
    }
    if ( uTruth != SFM_SAT_SAT )
        goto finish;
    if ( fRemoveOnly || p->pPars->fRrOnly || Vec_IntSize(p->vDivs) == 0 )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_IntSize(p->vDivs); i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            Vec_WrdForEachEntry( p->vDivCexes, uSign, i )
                printf( "%d", Abc_InfoHasBit((unsigned *)&uSign, p->nCexes-1) );
            printf( "\n" );
        }
        // find the next divisor to try
        uMask = (~(word)0) >> (64 - p->nCexes);
        Vec_WrdForEachEntry( p->vDivCexes, uSign, iVar )
            if ( uSign == uMask && Vec_IntEntry(p->vDivs, iVar) != iFaninSkip )
                break;
        if ( iVar == Vec_IntSize(p->vDivs) )
            return 0;
        assert( Vec_IntEntry(p->vDivs, iVar) != iFaninSkip );
        // try replacing the critical fanin
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, Vec_IntEntry(p->vDivs, iVar)) );
clk = Abc_Clock();
        uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
        // analyze outcomes
        if ( uTruth == SFM_SAT_UNDEC )
        {
            p->nTimeOuts++;
            return 0;
        }
        if ( uTruth != SFM_SAT_SAT )
            goto finish;
        if ( p->nCexes == 64 )
            return 0;
        // remove the last variable
        Vec_IntPop( p->vDivIds );
    }
finish:
    if ( p->pPars->fVeryVerbose )
    {
        if ( iVar == -1 )
            printf( "Node %d: Fanin %d (%d) can be removed.  ", iNode, f, Sfm_ObjFanin(p, iNode, f) );
        else
            printf( "Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ", 
            iNode, f, Sfm_ObjFanin(p, iNode, f), iVar, Vec_IntEntry(p->vDivs, iVar) );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, Vec_IntSize(p->vDivIds) ); printf( "\n" );
    }
    if ( iVar == -1 )
        p->nRemoves++;
    else
        p->nResubs++;
    if ( fSkipUpdate )
        return 0;
    // update the network
    Sfm_NtkUpdate( p, iNode, f, (iVar == -1 ? iVar : Vec_IntEntry(p->vDivs, iVar)), uTruth );
    return 1;
 }